

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O0

void duckdb::ArraySliceFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  LogicalTypeId LVar1;
  VectorType VVar2;
  Vector *begin_vector_00;
  reference pvVar3;
  LogicalType *pLVar4;
  reference pvVar5;
  idx_t iVar6;
  NotImplementedException *this;
  Vector *in_RDX;
  Vector *in_RSI;
  optional_ptr<duckdb::Vector,_true> in_RDI;
  bool end_is_empty;
  bool begin_is_empty;
  ListSliceBindData *info;
  BoundFunctionExpression *func_expr;
  optional_ptr<duckdb::Vector,_true> step_vector;
  Vector *end_vector;
  Vector *begin_vector;
  Vector *list_or_str_vector;
  idx_t count;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  allocator local_99;
  string local_98 [8];
  BaseExpression *in_stack_ffffffffffffff70;
  optional_ptr<duckdb::Vector,_true> local_48;
  optional_ptr<duckdb::Vector,_true> local_40;
  bool begin_is_empty_00;
  undefined2 uVar7;
  Vector *pVVar8;
  Vector *this_00;
  
  begin_vector_00 = (Vector *)DataChunk::size(in_RDI.ptr);
  pVVar8 = in_RDX;
  pvVar3 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)
                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  duckdb::VectorOperations::Copy(pvVar3,in_RDX,(ulong)begin_vector_00,0,0);
  pLVar4 = Vector::GetType(in_RDX);
  LVar1 = LogicalType::id(pLVar4);
  if (LVar1 == SQLNULL) {
    duckdb::Vector::SetVectorType((VectorType)pVVar8);
    duckdb::ConstantVector::SetNull(pVVar8,true);
  }
  else {
    pvVar3 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    pvVar5 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    uVar7 = (undefined2)((ulong)pvVar5 >> 0x30);
    optional_ptr<duckdb::Vector,_true>::optional_ptr(&local_40);
    iVar6 = DataChunk::ColumnCount((DataChunk *)0xd54b65);
    if (iVar6 == 4) {
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      optional_ptr<duckdb::Vector,_true>::optional_ptr(&local_48,pvVar5);
      local_40.ptr = local_48.ptr;
    }
    BaseExpression::Cast<duckdb::BoundFunctionExpression>(in_stack_ffffffffffffff70);
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator->
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    FunctionData::Cast<duckdb::ListSliceBindData>
              ((FunctionData *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    this_00 = pVVar8;
    duckdb::DataChunk::AllConstant();
    duckdb::Vector::SetVectorType((VectorType)pVVar8);
    pLVar4 = Vector::GetType(this_00);
    LVar1 = LogicalType::id(pLVar4);
    begin_is_empty_00 = SUB21((ushort)uVar7 >> 8,0);
    if (LVar1 == VARCHAR) {
      ExecuteSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
                (in_RSI,this_00,begin_vector_00,in_RDX,in_RDI,(idx_t)pvVar3,begin_is_empty_00,
                 SUB21(uVar7,0));
    }
    else if (LVar1 == BLOB) {
      ExecuteSlice<duckdb::string_t,long,duckdb::BlobSliceOperations>
                (in_RSI,this_00,begin_vector_00,in_RDX,in_RDI,(idx_t)pvVar3,begin_is_empty_00,
                 SUB21(uVar7,0));
    }
    else {
      if (LVar1 != LIST) {
        this = (NotImplementedException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,"Specifier type not implemented",&local_99);
        duckdb::NotImplementedException::NotImplementedException(this,local_98);
        __cxa_throw(this,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      VVar2 = Vector::GetVectorType(in_RDX);
      if (VVar2 != FLAT_VECTOR) {
        VVar2 = Vector::GetVectorType(in_RDX);
        if (VVar2 != CONSTANT_VECTOR) {
          duckdb::Vector::Flatten((ulong)in_RDX);
        }
      }
      ExecuteSlice<duckdb::list_entry_t,long,duckdb::ListSliceOperations>
                (in_RSI,this_00,begin_vector_00,in_RDX,in_RDI,(idx_t)pvVar3,
                 SUB21((ushort)uVar7 >> 8,0),SUB21(uVar7,0));
    }
  }
  return;
}

Assistant:

static void ArraySliceFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3 || args.ColumnCount() == 4);
	D_ASSERT(args.data.size() == 3 || args.data.size() == 4);
	auto count = args.size();

	Vector &list_or_str_vector = result;
	// this ensures that we do not change the input chunk
	VectorOperations::Copy(args.data[0], list_or_str_vector, count, 0, 0);

	if (list_or_str_vector.GetType().id() == LogicalTypeId::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}

	Vector &begin_vector = args.data[1];
	Vector &end_vector = args.data[2];

	optional_ptr<Vector> step_vector;
	if (args.ColumnCount() == 4) {
		step_vector = &args.data[3];
	}

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<ListSliceBindData>();
	auto begin_is_empty = info.begin_is_empty;
	auto end_is_empty = info.end_is_empty;

	result.SetVectorType(args.AllConstant() ? VectorType::CONSTANT_VECTOR : VectorType::FLAT_VECTOR);
	switch (result.GetType().id()) {
	case LogicalTypeId::LIST: {
		// Share the value dictionary as we are just going to slice it
		if (list_or_str_vector.GetVectorType() != VectorType::FLAT_VECTOR &&
		    list_or_str_vector.GetVectorType() != VectorType::CONSTANT_VECTOR) {
			list_or_str_vector.Flatten(count);
		}
		ExecuteSlice<list_entry_t, int64_t, ListSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                         step_vector, count, begin_is_empty, end_is_empty);
		break;
	}
	case LogicalTypeId::BLOB:
		ExecuteSlice<string_t, int64_t, BlobSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                     step_vector, count, begin_is_empty, end_is_empty);
		break;
	case LogicalTypeId::VARCHAR:
		ExecuteSlice<string_t, int64_t, StringSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                       step_vector, count, begin_is_empty, end_is_empty);
		break;
	default:
		throw NotImplementedException("Specifier type not implemented");
	}
}